

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O1

void __thiscall backend::codegen::RegAllocator::perform_load_stores(RegAllocator *this)

{
  size_t *psVar1;
  OpCode OVar2;
  _Head_base<0UL,_arm::Inst_*,_false> _Var3;
  _func_int **pp_Var4;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var5;
  int iVar6;
  pointer puVar7;
  long *plVar8;
  long lVar9;
  __node_base_ptr p_Var10;
  undefined8 *puVar11;
  Inst *__tmp;
  _Optional_payload_base<unsigned_int> pre_alloc_transient;
  Reg RVar12;
  _Storage<std::pair<unsigned_int,_unsigned_int>,_true> in_RSI;
  char *function;
  OpCode *r_00;
  Inst *pIVar13;
  int i_00;
  ulong uVar14;
  int i;
  Reg r_01;
  _List_node_base *p_Var15;
  _List_node_base *p_Var16;
  bool write_back;
  ReplaceWriteAction r_02;
  ReplaceWriteAction RVar17;
  __hashtable *__h;
  Reg r;
  ostream local_189;
  vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
  *local_188;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_180;
  Reg local_174;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  Function local_128;
  _List_node_base *local_d0;
  _func_int **local_c8;
  undefined1 local_c0 [16];
  undefined8 local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  undefined1 local_98;
  _func_int **local_90;
  _func_int **local_88;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_80;
  _func_int **local_78;
  _func_int **local_70;
  _func_int **local_68;
  _func_int **local_60;
  _func_int **local_58;
  _func_int **local_50;
  undefined **local_48;
  undefined8 local_40;
  undefined1 local_38;
  
  puVar7 = (this->f->inst).
           super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->f->inst).
      super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar7) {
    local_188 = (vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                 *)&this->inst_sink;
    local_50 = (_func_int **)&PTR_display_001f0908;
    local_58 = (_func_int **)&PTR_display_001f08c8;
    local_60 = (_func_int **)&PTR_display_001f0948;
    local_c8 = (_func_int **)&PTR_display_001f09c8;
    local_68 = (_func_int **)&PTR_display_001f0a08;
    local_70 = (_func_int **)&PTR_display_001f0a48;
    local_78 = (_func_int **)&PTR_display_001f0750;
    local_88 = (_func_int **)&PTR_display_001f0988;
    local_90 = (_func_int **)&PTR_display_001f0aa0;
    local_180 = &(this->wrote_to)._M_h;
    local_d0 = (_List_node_base *)&this->active_reg_map;
    local_80 = &(this->spilled_cross_block_reg)._M_h;
    local_170 = &(this->active)._M_h;
    uVar14 = 0;
    do {
      _Var3._M_head_impl =
           puVar7[uVar14]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
           _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
           super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
      local_189 = (ostream)0x0;
      AixLog::operator<<(&local_189,(Severity *)in_RSI);
      local_c0._0_8_ = &PTR__Tag_001edee0;
      local_c0._8_8_ = &local_a8;
      local_b0 = 0;
      local_a8 = 0;
      local_98 = 1;
      AixLog::operator<<((ostream *)local_c0,(Tag *)in_RSI);
      local_40 = std::chrono::_V2::system_clock::now();
      local_48 = &PTR__Timestamp_001edeb0;
      local_38 = 0;
      AixLog::operator<<((ostream *)&local_48,(Timestamp *)in_RSI);
      local_168 = &local_158;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"perform_load_stores","")
      ;
      function = 
      "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
      ;
      local_148 = &local_138;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_148,
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
                 ,"");
      local_128._vptr_Function = (_func_int **)&PTR__Function_001edf10;
      local_128.name._M_dataplus._M_p = (pointer)&local_128.name.field_2;
      if (local_168 == &local_158) {
        local_128.name.field_2._8_8_ = local_158._8_8_;
      }
      else {
        local_128.name._M_dataplus._M_p = (pointer)local_168;
      }
      local_128.name.field_2._M_allocated_capacity._1_7_ = local_158._M_allocated_capacity._1_7_;
      local_128.name.field_2._M_local_buf[0] = local_158._M_local_buf[0];
      local_128.name._M_string_length = local_160;
      local_160 = 0;
      local_158._M_local_buf[0] = '\0';
      local_128.file._M_dataplus._M_p = (pointer)&local_128.file.field_2;
      if (local_148 == &local_138) {
        local_128.file.field_2._8_8_ = local_138._8_8_;
      }
      else {
        local_128.file._M_dataplus._M_p = (pointer)local_148;
      }
      local_128.file.field_2._M_allocated_capacity._1_7_ = local_138._M_allocated_capacity._1_7_;
      local_128.file.field_2._M_local_buf[0] = local_138._M_local_buf[0];
      local_128.file._M_string_length = local_140;
      local_140 = 0;
      local_138._M_local_buf[0] = '\0';
      local_128.line = 0x39a;
      local_128.is_null_ = false;
      local_168 = &local_158;
      local_148 = &local_138;
      AixLog::operator<<((ostream *)&local_128,(Function *)function);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog," ",1);
      std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
      std::ostream::put(-0x80);
      plVar8 = (long *)std::ostream::flush();
      (*(code *)*((_Var3._M_head_impl)->super_Displayable)._vptr_Displayable)
                (_Var3._M_head_impl,plVar8);
      std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
      std::ostream::put((char)plVar8);
      std::ostream::flush();
      AixLog::Function::~Function(&local_128);
      if (local_148 != &local_138) {
        operator_delete(local_148,
                        CONCAT71(local_138._M_allocated_capacity._1_7_,local_138._M_local_buf[0]) +
                        1);
      }
      if (local_168 != &local_158) {
        operator_delete(local_168,
                        CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]) +
                        1);
      }
      local_c0._0_8_ = &PTR__Tag_001edee0;
      if ((undefined1 *)local_c0._8_8_ != &local_a8) {
        operator_delete((void *)local_c0._8_8_,CONCAT71(uStack_a7,local_a8) + 1);
      }
      this->cur_cond = (_Var3._M_head_impl)->cond;
      pp_Var4 = ((_Var3._M_head_impl)->super_Displayable)._vptr_Displayable;
      i_00 = (int)uVar14;
      if (pp_Var4 == local_50) {
        replace_read(this,(Reg *)((long)(_Var3._M_head_impl + 1) + 4),i_00,
                     (optional<unsigned_int>)0x0);
        goto LAB_00175d05;
      }
      if (pp_Var4 == local_58) {
        replace_read(this,(Reg *)((long)(_Var3._M_head_impl + 1) + 4),i_00,
                     (optional<unsigned_int>)0x0);
        replace_read(this,(OpCode *)((long)(_Var3._M_head_impl + 1) + 8),i_00,
                     (optional<unsigned_int>)0x0);
        r_00 = (OpCode *)((long)(_Var3._M_head_impl + 1) + 0xc);
LAB_00175d38:
        replace_read(this,r_00,i_00,(optional<unsigned_int>)0x0);
LAB_00175d45:
        invalidate_read(this,i_00);
        pIVar13 = _Var3._M_head_impl + 1;
        local_128._vptr_Function = (_func_int **)local_180;
        std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_180,pIVar13,&local_128);
        pre_alloc_transient._M_payload = (_Storage<unsigned_int,_true>)0x0;
        pre_alloc_transient._M_engaged = false;
        pre_alloc_transient._5_3_ = 0;
LAB_00175d76:
        RVar17 = pre_replace_write(this,(Reg *)pIVar13,i_00,
                                   (optional<unsigned_int>)pre_alloc_transient);
        in_RSI = RVar17._0_8_;
        std::
        vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
        ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                  (local_188,
                   (this->f->inst).
                   super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar14);
        replace_write(this,RVar17,i_00);
      }
      else {
        if (pp_Var4 == local_60) {
          OVar2 = (_Var3._M_head_impl)->op;
          if (OVar2 == Mvn) {
LAB_00175d05:
            if (*(char *)&_Var3._M_head_impl[3].super_Displayable == '\0') {
              r_00 = (OpCode *)((long)(_Var3._M_head_impl + 2) + 8);
              goto LAB_00175d38;
            }
            goto LAB_00175d45;
          }
          if (OVar2 != MovT) {
            if (OVar2 != Mov) {
              replace_read(this,(Reg *)(_Var3._M_head_impl + 1),i_00,(optional<unsigned_int>)0x0);
              if (*(char *)&_Var3._M_head_impl[3].super_Displayable == '\0') {
                pIVar13 = (Inst *)((long)(_Var3._M_head_impl + 2) + 8);
                goto LAB_00175e5e;
              }
              goto LAB_00175e6e;
            }
            goto LAB_00175d05;
          }
          local_c0._0_4_ = *(undefined4 *)&_Var3._M_head_impl[1].super_Displayable;
          replace_read(this,(Reg *)(_Var3._M_head_impl + 1),i_00,(optional<unsigned_int>)0x0);
          invalidate_read(this,i_00);
          local_128._vptr_Function = (_func_int **)local_180;
          std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_180,_Var3._M_head_impl + 1,&local_128);
          pre_alloc_transient =
               (_Optional_payload_base<unsigned_int>)
               ((ulong)*(uint *)&_Var3._M_head_impl[1].super_Displayable | 0x100000000);
          pIVar13 = (Inst *)local_c0;
          goto LAB_00175d76;
        }
        if (_Var3._M_head_impl != (Inst *)0x0 && pp_Var4 == local_c8) {
          if (*(undefined1 *)((long)(_Var3._M_head_impl + 4) + 8) == B) {
            replace_read(this,(MemoryOperand *)((long)(_Var3._M_head_impl + 1) + 8),i_00);
          }
          if ((_Var3._M_head_impl)->op != LdR) {
            pIVar13 = _Var3._M_head_impl + 1;
LAB_00175e5e:
            replace_read(this,(Reg *)pIVar13,i_00,(optional<unsigned_int>)0x0);
            goto LAB_00175e6e;
          }
          goto LAB_00175d45;
        }
        if (pp_Var4 == local_68) {
          puVar11 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar11 = &PTR__exception_001ef1e8;
          __cxa_throw(puVar11,&prelude::NotImplementedException::typeinfo,std::exception::~exception
                     );
        }
        if (pp_Var4 == local_70) {
LAB_00175e6e:
          invalidate_read(this,i_00);
LAB_00175e79:
          in_RSI = (_Storage<std::pair<unsigned_int,_unsigned_int>,_true>)
                   ((this->f->inst).
                    super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar14);
          std::
          vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
          ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                    (local_188,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_RSI);
        }
        else {
          if (_Var3._M_head_impl == (Inst *)0x0 || pp_Var4 != local_78) {
            if (_Var3._M_head_impl == (Inst *)0x0 || pp_Var4 != local_88) {
              if ((_Var3._M_head_impl != (Inst *)0x0 && pp_Var4 == local_90) &&
                 (iVar6 = std::__cxx11::string::compare((char *)(_Var3._M_head_impl + 1)),
                 iVar6 == 0)) {
                iVar6 = std::any_cast<int>((any *)(_Var3._M_head_impl + 3));
                this->stack_offset = this->stack_offset + iVar6;
              }
              goto LAB_00175e6e;
            }
            if (((this->delayed_store).
                 super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
                 super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_engaged ==
                 true) &&
               (RVar17.kind = Spill,
               RVar17._0_8_ = (this->delayed_store).
                              super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>.
                              _M_payload, replace_write(this,RVar17,i_00),
               (this->delayed_store).
               super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
               super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_engaged ==
               true)) {
              (this->delayed_store).
              super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
              super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_engaged =
                   false;
            }
            invalidate_read(this,i_00);
            p_Var5 = local_170;
            if ((_Var3._M_head_impl)->op == B) {
              if (this->bb_reset == true) {
                p_Var15 = (((_List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                             *)&local_d0->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
                if (p_Var15 != local_d0) {
                  do {
                    p_Var10 = std::
                              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                              ::_M_find_before_node
                                        (local_80,(ulong)*(uint *)&p_Var15[1]._M_next %
                                                  (this->spilled_cross_block_reg)._M_h.
                                                  _M_bucket_count,(key_type_conflict *)(p_Var15 + 1)
                                         ,(ulong)*(uint *)&p_Var15[1]._M_next);
                    if ((p_Var10 == (__node_base_ptr)0x0) ||
                       (p_Var10->_M_nxt == (_Hash_node_base *)0x0)) {
                      p_Var16 = p_Var15->_M_next;
                    }
                    else {
                      local_174 = *(Reg *)((long)&p_Var15[1]._M_next + 4);
                      p_Var10 = std::
                                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                ::_M_find_before_node
                                          (local_180,
                                           (ulong)*(uint *)&p_Var15[1]._M_next %
                                           (this->wrote_to)._M_h._M_bucket_count,
                                           (key_type_conflict *)(p_Var15 + 1),
                                           (ulong)*(uint *)&p_Var15[1]._M_next);
                      if (p_Var10 == (__node_base_ptr)0x0) {
                        write_back = false;
                      }
                      else {
                        write_back = p_Var10->_M_nxt != (_Hash_node_base *)0x0;
                      }
                      force_free(this,local_174,false,write_back);
                      std::
                      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::_M_erase(local_170,(undefined1 *)((long)&p_Var15[1]._M_next + 4));
                      p_Var16 = p_Var15->_M_next;
                      psVar1 = &(this->active_reg_map).
                                super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                ._M_impl._M_node._M_size;
                      *psVar1 = *psVar1 - 1;
                      std::__detail::_List_node_base::_M_unhook();
                      operator_delete(p_Var15,0x18);
                    }
                    p_Var15 = p_Var16;
                  } while (p_Var16 != local_d0);
                }
                std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::clear(local_180);
                this->bb_reset = false;
              }
            }
            else if ((_Var3._M_head_impl)->op == Bl) {
              this->is_leaf_func = false;
              local_174 = *(Reg *)&_Var3._M_head_impl[3].super_Displayable;
              r_01 = 4;
              if ((int)local_174 < 4) {
                r_01 = local_174;
              }
              if (0 < (int)local_174) {
                RVar12 = 0;
                do {
                  local_128._vptr_Function =
                       (_func_int **)CONCAT44(local_128._vptr_Function._4_4_,RVar12);
                  std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::_M_erase(p_Var5,&local_128);
                  RVar12 = RVar12 + 1;
                } while (r_01 != RVar12);
              }
              if ((int)local_174 < 4) {
                do {
                  force_free(this,r_01,true,true);
                  r_01 = r_01 + 1;
                } while (r_01 != 4);
              }
              force_free(this,0xc,true,true);
              force_free(this,0xe,true,true);
              std::
              vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
              ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                        (local_188,
                         (this->f->inst).
                         super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar14);
              p_Var5 = local_170;
              local_128._vptr_Function =
                   (_func_int **)((ulong)local_128._vptr_Function & 0xffffffff00000000);
              in_RSI = (_Storage<std::pair<unsigned_int,_unsigned_int>,_true>)&local_128;
              std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::_M_erase(local_170,in_RSI);
              local_128._vptr_Function._0_4_ = 1;
              std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::_M_erase(p_Var5,in_RSI);
              local_128._vptr_Function._0_4_ = 2;
              std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::_M_erase(p_Var5,in_RSI);
              local_128._vptr_Function._0_4_ = 3;
              std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::_M_erase(p_Var5,in_RSI);
              local_128._vptr_Function._0_4_ = 0xc;
              std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::_M_erase(p_Var5,in_RSI);
              local_128._vptr_Function = (_func_int **)CONCAT44(local_128._vptr_Function._4_4_,0xe);
              std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::_M_erase(p_Var5);
              goto LAB_00175da9;
            }
            goto LAB_00175e79;
          }
          invalidate_read(this,i_00);
          std::
          vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
          ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                    (local_188,
                     (this->f->inst).
                     super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar14);
          lVar9 = std::__cxx11::string::find((char *)(_Var3._M_head_impl + 1),0x1bbc91,0);
          if (((lVar9 == 0) &&
              (puVar7 = (this->inst_sink).
                        super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
              8 < (ulong)((long)puVar7 -
                         (long)(this->inst_sink).
                               super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start))) &&
             (pIVar13 = puVar7[-2]._M_t.
                        super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
                        super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                        super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl,
             (pIVar13->super_Displayable)._vptr_Displayable == local_c8)) {
            puVar7[-2]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
            super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
                 puVar7[-1]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                 _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                 super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
            puVar7[-1]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
            super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = pIVar13;
          }
          in_RSI = (_Storage<std::pair<unsigned_int,_unsigned_int>,_true>)0x0;
          lVar9 = std::__cxx11::string::find((char)(_Var3._M_head_impl + 1),0);
          if (lVar9 != 0) {
            this->bb_reset = true;
          }
        }
      }
LAB_00175da9:
      if ((this->delayed_store).
          super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
          super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_engaged == true) {
        in_RSI = (this->delayed_store).
                 super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
                 super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_payload;
        r_02.kind = Spill;
        r_02._0_8_ = in_RSI;
        replace_write(this,r_02,i_00);
        if ((this->delayed_store).
            super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
            super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_engaged == true)
        {
          (this->delayed_store).
          super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
          super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_engaged = false;
        }
      }
      uVar14 = uVar14 + 1;
      puVar7 = (this->f->inst).
               super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar14 < (ulong)((long)(this->f->inst).
                                    super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 3))
    ;
  }
  return;
}

Assistant:

void RegAllocator::perform_load_stores() {
  for (int i = 0; i < f.inst.size(); i++) {
    auto inst_ = &*f.inst[i];
    LOG(TRACE) << " " << std::endl << *inst_ << std::endl;
    cur_cond = inst_->cond;
    if (auto x = dynamic_cast<Arith3Inst *>(inst_)) {
      replace_read(x->r1, i);
      replace_read(x->r2, i);
      invalidate_read(i);
      wrote_to.insert(x->rd);
      auto prw = pre_replace_write(x->rd, i);
      inst_sink.push_back(std::move(f.inst[i]));
      replace_write(prw, i);
    } else if (auto x = dynamic_cast<Arith4Inst *>(inst_)) {
      replace_read(x->r1, i);
      replace_read(x->r2, i);
      replace_read(x->r3, i);
      invalidate_read(i);
      wrote_to.insert(x->rd);
      auto prw = pre_replace_write(x->rd, i);
      inst_sink.push_back(std::move(f.inst[i]));
      replace_write(prw, i);
    } else if (auto x = dynamic_cast<Arith2Inst *>(inst_)) {
      if (x->op == arm::OpCode::Mov || x->op == arm::OpCode::Mvn) {
        replace_read(x->r2, i);
        invalidate_read(i);
        wrote_to.insert(x->r1);
        auto prw = pre_replace_write(x->r1, i);
        inst_sink.push_back(std::move(f.inst[i]));
        replace_write(prw, i);
      } else if (x->op == arm::OpCode::MovT) {
        auto r = x->r1;
        replace_read(x->r1, i);
        invalidate_read(i);
        wrote_to.insert(x->r1);
        auto prw = pre_replace_write(r, i, x->r1);
        inst_sink.push_back(std::move(f.inst[i]));
        replace_write(prw, i);
      } else {
        replace_read(x->r1, i);
        replace_read(x->r2, i);
        invalidate_read(i);
        inst_sink.push_back(std::move(f.inst[i]));
      }
    } else if (auto x = dynamic_cast<LoadStoreInst *>(inst_)) {
      if (auto mem = std::get_if<MemoryOperand>(&x->mem)) {
        replace_read(*mem, i);
      }
      if (x->op == arm::OpCode::LdR) {
        invalidate_read(i);
        wrote_to.insert(x->rd);
        auto prw = pre_replace_write(x->rd, i);
        inst_sink.push_back(std::move(f.inst[i]));
        replace_write(prw, i);
      } else {
        // StR
        replace_read(x->rd, i);
        invalidate_read(i);
        inst_sink.push_back(std::move(f.inst[i]));
      }
    } else if (auto x = dynamic_cast<MultLoadStoreInst *>(inst_)) {
      throw prelude::NotImplementedException();
      if (x->op == arm::OpCode::LdM) {
        for (auto rd : x->rd) add_reg_write(rd, i);
      } else {
        // StM
        for (auto rd : x->rd) add_reg_read(rd, i);
      }
      invalidate_read(i);
      add_reg_read(x->rn, i);
    } else if (auto x = dynamic_cast<PushPopInst *>(inst_)) {
      // push pop only use gpr
      invalidate_read(i);
      inst_sink.push_back(std::move(f.inst[i]));
    } else if (auto x = dynamic_cast<LabelInst *>(inst_)) {
      invalidate_read(i);

      inst_sink.push_back(std::move(f.inst[i]));
      if (x->label.find(".ld_pc") == 0 && inst_sink.size() >= 2 &&
          dynamic_cast<LoadStoreInst *>(&**(inst_sink.end() - 2))) {
        // HACK: If it's load_pc label, delay store once more
        std::swap(*(inst_sink.end() - 2), *(inst_sink.end() - 1));
      }
      if (x->label.find(".bb" == 0)) {
        bb_reset = true;
      }
    } else if (auto x = dynamic_cast<BrInst *>(inst_)) {
      if (delayed_store) {
        // TODO: check if this is right
        auto [r, rd] = delayed_store.value();
        replace_write({r, rd, ReplaceWriteKind::Spill}, i);
        delayed_store = {};
      }
      invalidate_read(i);
      if (x->op == arm::OpCode::Bl) {
        is_leaf_func = false;
        auto &label = x->l;
        int param_cnt = x->param_cnt;
        int reg_cnt = std::min(param_cnt, 4);
        for (int i = 0; i < reg_cnt; i++) active.erase(Reg(i));
        for (int i = reg_cnt; i < 4; i++) force_free(Reg(i));
        // R12 should be freed whatever condition
        force_free(Reg(12));
        force_free(Reg(REG_LR));
        inst_sink.push_back(std::move(f.inst[i]));
        active.erase(Reg(0));
        active.erase(Reg(1));
        active.erase(Reg(2));
        active.erase(Reg(3));
        active.erase(Reg(12));
        active.erase(Reg(REG_LR));
      } else if (x->op == arm::OpCode::B) {
        if (bb_reset) {
          auto it = active_reg_map.begin();

          while (it != active_reg_map.end()) {
            if (spilled_cross_block_reg.find(it->first) !=
                spilled_cross_block_reg.end()) {
              force_free(it->second, false,
                         wrote_to.find(it->first) != wrote_to.end());
              active.erase(it->second);
              it = active_reg_map.erase(it);
            } else {
              it++;
            }
          }
          wrote_to.clear();
          bb_reset = false;
        }
        inst_sink.push_back(std::move(f.inst[i]));
      } else {
        inst_sink.push_back(std::move(f.inst[i]));
      }
    } else if (auto x = dynamic_cast<CtrlInst *>(inst_)) {
      if (x->key == "offset_stack") {
        int offset = std::any_cast<int>(x->val);
        stack_offset += offset;
      }
      invalidate_read(i);
      inst_sink.push_back(std::move(f.inst[i]));
    } else {
      invalidate_read(i);
      inst_sink.push_back(std::move(f.inst[i]));
    }
    if (delayed_store) {
      // TODO: check if this is right
      auto [r, rd] = delayed_store.value();
      replace_write({r, rd, ReplaceWriteKind::Spill}, i);
      delayed_store = {};
    }
  }
}